

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::write_decimal<int>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *this,int value)

{
  char *pcVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  char_type buffer [13];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_48;
  char local_35 [13];
  
  uVar4 = (ulong)(uint)-value;
  if (0 < value) {
    uVar4 = (ulong)(uint)value;
  }
  uVar3 = (uint)uVar4;
  uVar6 = 0x1f;
  if ((uVar3 | 1) != 0) {
    for (; (uVar3 | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  uVar6 = (uVar6 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar7 = (ulong)((uVar6 - (uVar3 < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                             (ulong)uVar6 * 4))) + 1);
  if (value < 0) {
    local_48._M_stream = (ostream_type *)CONCAT71(local_48._M_stream._1_7_,0x2d);
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
              (&this->out_,(char *)&local_48);
  }
  pcVar1 = local_35 + uVar7;
  if (99 < uVar3) {
    do {
      uVar6 = (uint)uVar4;
      uVar3 = (uint)(uVar4 / 100);
      uVar4 = uVar4 / 100;
      *(undefined2 *)(pcVar1 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uVar6 + (int)uVar4 * -100) * 2);
      pcVar1 = pcVar1 + -2;
    } while (9999 < uVar6);
  }
  local_48._M_stream = (this->out_)._M_stream;
  local_48._M_string = (this->out_)._M_string;
  if (uVar3 < 10) {
    bVar2 = (byte)uVar3 | 0x30;
    lVar5 = -1;
  }
  else {
    pcVar1[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar3 * 2 & 0xffffffff) + 1];
    bVar2 = internal::basic_data<void>::DIGITS[(ulong)uVar3 * 2];
    lVar5 = -2;
  }
  pcVar1[lVar5] = bVar2;
  if (uVar7 != 0) {
    pcVar1 = local_35;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_48,pcVar1);
      pcVar1 = pcVar1 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  (this->out_)._M_stream = local_48._M_stream;
  (this->out_)._M_string = local_48._M_string;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }